

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_tree_builder.h
# Opt level: O3

Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> * __thiscall
bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::build_top_bvh
          (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *__return_storage_ptr__,
          MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *this,
          vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          *mini_trees)

{
  long *plVar1;
  long *plVar2;
  _Vector_impl_data *p_Var3;
  undefined8 *puVar4;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [64];
  uint *puVar12;
  Config *pCVar13;
  void *pvVar14;
  pointer pNVar15;
  pointer puVar16;
  unsigned_long uVar17;
  undefined1 (*pauVar18) [16];
  pointer pBVar19;
  long lVar20;
  undefined1 auVar21 [16];
  long lVar22;
  pointer *ppuVar23;
  vector<unsigned_long,_std::allocator<unsigned_long>_> **ppvVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  pointer pBVar28;
  size_t __n;
  ThreadPool *pTVar29;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  size_type __new_size;
  long lVar30;
  code *__new_size_00;
  pointer pNVar31;
  ulong uVar32;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  size_type __new_size_01;
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_sweep_sah_builder_h:60:71)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_sweep_sah_builder_h:60:71)>
  __comp_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> prim_offsets;
  vector<unsigned_long,_std::allocator<unsigned_long>_> node_offsets;
  anon_class_16_2_cdc430d5 copy_node;
  vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> bboxes;
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> centers;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1a8;
  MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *local_190;
  ulong local_188;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_180;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_168;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_160;
  vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> local_158;
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> local_140;
  unique_lock<std::mutex> local_128;
  _Any_data local_118;
  code *pcStack_108;
  pointer pVStack_100;
  size_t local_f8;
  Config *local_f0;
  vector<bool,_std::allocator<bool>_> local_e8;
  vector<float,_std::allocator<float>_> vStack_c0;
  undefined1 auStack_a8 [32];
  undefined1 auStack_88 [40];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  Config local_58;
  
  std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::vector
            (&local_140,
             ((long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,
             (allocator_type *)local_118._M_pod_data);
  std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::vector
            (&local_158,
             ((long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,
             (allocator_type *)local_118._M_pod_data);
  pBVar28 = (mini_trees->
            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((mini_trees->
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pBVar28) {
    lVar22 = 0;
    uVar26 = 0;
    do {
      puVar12 = *(uint **)((long)&(pBVar28->nodes).
                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar22 * 4);
      uVar26 = uVar26 + 1;
      uVar6 = puVar12[4];
      uVar25 = puVar12[5];
      auVar36 = vinsertps_avx(ZEXT416(*puVar12),ZEXT416(puVar12[2]),0x10);
      auVar21 = vinsertps_avx(ZEXT416(puVar12[1]),ZEXT416(puVar12[3]),0x10);
      uVar9 = vmovlps_avx(auVar36);
      *(undefined8 *)
       ((long)((local_158.
                super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->min).values + lVar22 * 2) = uVar9;
      *(uint *)((long)((local_158.
                        super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar22 * 2 + -4) =
           uVar6;
      uVar9 = vmovlps_avx(auVar21);
      *(undefined8 *)
       ((long)((local_158.
                super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar22 * 2) = uVar9;
      *(uint *)((long)((local_158.
                        super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar22 * 2 + 8) =
           uVar25;
      fVar7 = *(float *)((long)((local_158.
                                 super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->max).values +
                        lVar22 * 2 + 8);
      uVar9 = *(undefined8 *)
               ((long)((local_158.
                        super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->min).values + lVar22 * 2);
      uVar10 = *(undefined8 *)
                ((long)((local_158.
                         super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar22 * 2);
      fVar8 = *(float *)((long)((local_158.
                                 super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->max).values +
                        lVar22 * 2 + -4);
      auVar36._0_4_ = ((float)uVar10 + (float)uVar9) * 0.5;
      auVar36._4_4_ = ((float)((ulong)uVar10 >> 0x20) + (float)((ulong)uVar9 >> 0x20)) * 0.5;
      auVar36._8_8_ = 0;
      uVar9 = vmovlps_avx(auVar36);
      *(undefined8 *)
       ((long)(local_140.
               super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->values + lVar22) = uVar9;
      *(float *)((long)(local_140.
                        super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->values + lVar22 + 8) =
           (fVar7 + fVar8) * 0.5;
      lVar22 = lVar22 + 0xc;
      pBVar28 = (mini_trees->
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar26 < (ulong)(((long)(mini_trees->
                                     super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar28 >>
                              4) * -0x5555555555555555));
  }
  pCVar13 = this->config_;
  local_f0 = &local_58;
  local_58.sah.cost_ratio_ = (pCVar13->super_Config).sah.cost_ratio_;
  local_58.sah._20_4_ = *(undefined4 *)&(pCVar13->super_Config).sah.field_0x14;
  __new_size_00 =
       (code *)(((long)local_158.
                       super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_158.
                       super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_58.sah.log_cluster_size_ = (pCVar13->super_Config).sah.log_cluster_size_;
  local_58.sah.prim_offset_ = (pCVar13->super_Config).sah.prim_offset_;
  local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_140.
                super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar22 = (long)local_140.
                 super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_140.
                 super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2;
  local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(lVar22 * -0x5555555555555555);
  local_118._M_unused._M_object = &PTR___cxa_pure_virtual_00115cf8;
  local_118._8_8_ =
       local_158.
       super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pVStack_100 = local_140.
                super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_58.min_leaf_size = 1;
  local_58.max_leaf_size = 1;
  local_190 = this;
  pcStack_108 = __new_size_00;
  local_f8 = (size_t)local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
  if (__new_size_00 + lVar22 * 0x5555555555555555 != (code *)0x0) {
    __assert_fail("bboxes.size() == centers.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                  ,0x3f,
                  "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                 );
  }
  local_118._M_unused._M_object = &PTR_get_prim_ids_00115d18;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  auVar33 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = auVar33._0_8_;
  vStack_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = auVar33._8_8_;
  vStack_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = auVar33._16_8_;
  vStack_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = auVar33._24_8_;
  auStack_a8._0_8_ = auVar33._32_8_;
  auVar33 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auStack_a8._8_24_ = auVar33._0_24_;
  auStack_88 = auVar33._24_40_;
  std::vector<bool,_std::allocator<bool>_>::resize(&local_e8,(size_type)__new_size_00,false);
  std::vector<float,_std::allocator<float>_>::resize(&vStack_c0,(size_type)__new_size_00);
  local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  do {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (auStack_a8 +
               (long)local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start * 0x18),(size_type)__new_size_00);
    __first._M_current =
         *(unsigned_long **)
          (auStack_a8 +
          (long)local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start * 0x18);
    __last._M_current =
         *(unsigned_long **)
          (auStack_a8 +
          (long)local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start * 0x18 + 8);
    if (__first._M_current != __last._M_current) {
      auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar34 = vpbroadcastq_avx512f(ZEXT816(8));
      uVar26 = 0;
      auVar35 = vpbroadcastq_avx512f();
      auVar35 = vpsrlq_avx512f(auVar35,3);
      do {
        vpcmpuq_avx512f(auVar33,auVar35,2);
        auVar11 = vmovdqu64_avx512f(auVar33);
        *(undefined1 (*) [64])(__first._M_current + uVar26) = auVar11;
        uVar26 = uVar26 + 8;
        auVar33 = vpaddq_avx512f(auVar33,auVar34);
      } while ((((ulong)((long)__last._M_current + (-8 - (long)__first._M_current)) >> 3) + 8 &
               0xfffffffffffffff8) != uVar26);
      __first._M_current =
           *(unsigned_long **)
            (auStack_a8 +
            (long)local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start * 0x18);
      __last._M_current =
           *(unsigned_long **)
            (auStack_a8 +
            (long)local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start * 0x18 + 8);
    }
    if (__first._M_current != __last._M_current) {
      __comp._M_comp.axis = (size_t *)&local_1a8;
      __comp._M_comp.centers =
           (span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> *)&local_180;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::SweepSahBuilder(std::span<bvh::v2::BBox<float,3ul>const,18446744073709551615ul>,std::span<bvh::v2::Vec<float,3ul>const,18446744073709551615ul>,bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long,unsigned_long)_1_>>
                (__first,__last,
                 (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current >> 3)
                              * 2) ^ 0x7e,__comp);
      __comp_00._M_comp.axis = (size_t *)&local_1a8;
      __comp_00._M_comp.centers =
           (span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> *)&local_180;
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::SweepSahBuilder(std::span<bvh::v2::BBox<float,3ul>const,18446744073709551615ul>,std::span<bvh::v2::Vec<float,3ul>const,18446744073709551615ul>,bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long,unsigned_long)_1_>>
                (__first,__last,__comp_00);
    }
    local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
  } while (local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start < (pointer)0x3);
  TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
            (__return_storage_ptr__,
             (TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)&local_118);
  lVar22 = 0xb0;
  local_118._M_unused._M_object = &PTR_get_prim_ids_00115d18;
  do {
    pvVar14 = *(void **)((long)&local_128._M_device + lVar22);
    if (pvVar14 != (void *)0x0) {
      operator_delete(pvVar14,*(long *)((long)&local_118 + lVar22) - (long)pvVar14);
    }
    lVar22 = lVar22 + -0x18;
  } while (lVar22 != 0x68);
  if (vStack_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vStack_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_180,
             ((long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,
             (allocator_type *)local_118._M_pod_data);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_1a8,
             ((long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(mini_trees->
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,
             (allocator_type *)local_118._M_pod_data);
  pNVar15 = (__return_storage_ptr__->nodes).
            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pNVar31 = (__return_storage_ptr__->nodes).
            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar28 = (mini_trees->
            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  __new_size = ((long)pNVar15 - (long)pNVar31 >> 2) * 0x6db6db6db6db6db7;
  lVar22 = (long)(mini_trees->
                 super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar28;
  if (lVar22 == 0) {
    __new_size_01 = 0;
  }
  else {
    lVar22 = (lVar22 >> 4) * -0x5555555555555555;
    ppuVar23 = (pointer *)
               ((long)&(pBVar28->prim_ids).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8
               );
    lVar30 = 0;
    __new_size_01 = 0;
    do {
      *(size_type *)
       ((float *)local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start + lVar30 * 2) = __new_size - 1;
      local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar30] = __new_size_01;
      lVar30 = lVar30 + 1;
      plVar1 = (long *)(ppuVar23 + -3);
      puVar16 = *ppuVar23;
      plVar2 = (long *)(ppuVar23 + -4);
      p_Var3 = (_Vector_impl_data *)(ppuVar23 + -1);
      ppuVar23 = ppuVar23 + 6;
      __new_size_01 = ((long)puVar16 - (long)p_Var3->_M_start >> 3) + __new_size_01;
      __new_size = (__new_size - 1) + (*plVar1 - *plVar2 >> 2) * 0x6db6db6db6db6db7;
    } while (lVar22 + (ulong)(lVar22 == 0) != lVar30);
  }
  local_168 = &local_1a8;
  local_160 = &local_180;
  if (pNVar31 != pNVar15) {
    do {
      uVar6 = (pNVar31->index).value;
      uVar25 = uVar6 & 0xf;
      if (uVar25 != 0) {
        if (uVar25 != 1) {
          __assert_fail("node.index.prim_count() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/mini_tree_builder.h"
                        ,0x11d,
                        "Bvh<Node> bvh::v2::MiniTreeBuilder<bvh::v2::Node<float, 3>>::build_top_bvh(std::vector<Bvh<Node>> &) [Node = bvh::v2::Node<float, 3>, MortonCode = unsigned int]"
                       );
        }
        uVar17 = (__return_storage_ptr__->prim_ids).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6 >> 4];
        pauVar18 = *(undefined1 (**) [16])
                    &(mini_trees->
                     super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar17].nodes.
                     super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                     ._M_impl;
        auVar36 = *pauVar18;
        *(undefined1 (*) [16])((pNVar31->bounds)._M_elems + 3) =
             *(undefined1 (*) [16])(*pauVar18 + 0xc);
        *(undefined1 (*) [16])(pNVar31->bounds)._M_elems = auVar36;
        uVar6 = (pNVar31->index).value;
        ppvVar24 = &local_168;
        if ((pauVar18[1][8] & 0xf) == 0) {
          ppvVar24 = &local_160;
        }
        Index<32UL,_4UL>::Index
                  ((Index<32UL,_4UL> *)&local_118,
                   (ulong)(uVar6 >> 4) +
                   ((*ppvVar24)->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar17],(ulong)(uVar6 & 0xf));
        (pNVar31->index).value = local_118._0_4_;
      }
      pNVar31 = pNVar31 + 1;
    } while (pNVar31 != pNVar15);
  }
  std::
  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ::resize(&__return_storage_ptr__->nodes,__new_size);
  local_60 = &__return_storage_ptr__->prim_ids;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_60,__new_size_01);
  pBVar28 = (mini_trees->
            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pBVar19 = (mini_trees->
            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_188 = ((long)pBVar28 - (long)pBVar19 >> 4) * -0x5555555555555555;
  if (local_188 < (local_190->executor_).parallel_threshold) {
    if (pBVar28 != pBVar19) {
      uVar26 = 0;
      do {
        pBVar19 = (mini_trees->
                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pBVar28 = pBVar19 + uVar26;
        lVar22 = *(long *)&pBVar19[uVar26].nodes.
                           super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                           ._M_impl;
        if (1 < (ulong)(((long)*(pointer *)
                                ((long)&pBVar19[uVar26].nodes.
                                        super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                        ._M_impl + 8) - lVar22 >> 2) * 0x6db6db6db6db6db7)) {
          uVar32 = 1;
          lVar30 = 0x34;
          do {
            puVar4 = (undefined8 *)(lVar22 + -0x18 + lVar30);
            uVar9 = *puVar4;
            uVar10 = puVar4[1];
            lVar20 = *(long *)((float *)local_180.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar26 * 2);
            pNVar15 = (__return_storage_ptr__->nodes).
                      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(undefined1 (*) [16])((long)pNVar15[lVar20].bounds._M_elems + lVar30 + -0xc) =
                 *(undefined1 (*) [16])(lVar22 + -0xc + lVar30);
            puVar4 = (undefined8 *)((long)(&pNVar15[lVar20].bounds + 0xffffffffffffffff) + lVar30);
            *puVar4 = uVar9;
            puVar4[1] = uVar10;
            uVar6 = *(uint *)((long)pNVar15[lVar20].bounds._M_elems + lVar30);
            ppvVar24 = &local_168;
            if ((*(byte *)(lVar22 + lVar30) & 0xf) == 0) {
              ppvVar24 = &local_160;
            }
            Index<32UL,_4UL>::Index
                      ((Index<32UL,_4UL> *)&local_118,
                       (ulong)(uVar6 >> 4) +
                       ((*ppvVar24)->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar26],(ulong)(uVar6 & 0xf));
            uVar32 = uVar32 + 1;
            *(undefined4 *)((long)pNVar15[lVar20].bounds._M_elems + lVar30) = local_118._0_4_;
            lVar30 = lVar30 + 0x1c;
            lVar22 = *(long *)&(pBVar28->nodes).
                               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                               ._M_impl;
          } while (uVar32 < (ulong)(((long)*(pointer *)
                                            ((long)&(pBVar28->nodes).
                                                                                                        
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl + 8) - lVar22 >> 2) * 0x6db6db6db6db6db7)
                  );
        }
        pvVar14 = (pBVar28->prim_ids).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        __n = (long)*(pointer *)
                     ((long)&(pBVar28->prim_ids).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl + 8) - (long)pvVar14;
        if (__n != 0) {
          memmove((local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start +
                  local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar26],pvVar14,__n);
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != local_188);
    }
  }
  else {
    pTVar29 = (local_190->executor_).thread_pool;
    uVar26 = local_188 /
             (ulong)((long)(pTVar29->threads_).
                           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pTVar29->threads_).
                           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3);
    if (pBVar28 != pBVar19) {
      uVar32 = 0;
      do {
        pTVar29 = (local_190->executor_).thread_pool;
        local_118._M_unused._M_object = (void *)0x0;
        local_118._8_8_ = (void *)0x0;
        pcStack_108 = (code *)0x0;
        pVStack_100 = (pointer)0x0;
        local_118._M_unused._M_object = operator_new(0x38);
        uVar5 = uVar32 + uVar26 + (uVar26 == 0);
        *(vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          **)local_118._M_unused._0_8_ = mini_trees;
        *(vector<unsigned_long,_std::allocator<unsigned_long>_> ***)
         ((long)local_118._M_unused._0_8_ + 8) = &local_168;
        *(Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> **)((long)local_118._M_unused._0_8_ + 0x10) =
             __return_storage_ptr__;
        uVar27 = local_188;
        if (uVar5 < local_188) {
          uVar27 = uVar5;
        }
        *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
         ((long)local_118._M_unused._0_8_ + 0x18) = &local_180;
        *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
         ((long)local_118._M_unused._0_8_ + 0x20) = &local_1a8;
        *(ulong *)((long)local_118._M_unused._0_8_ + 0x28) = uVar32;
        *(ulong *)((long)local_118._M_unused._0_8_ + 0x30) = uVar27;
        pVStack_100 = (pointer)std::
                               _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                               ::_M_invoke;
        local_128._M_device = &pTVar29->mutex_;
        pcStack_108 = std::
                      _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                      ::_M_manager;
        local_128._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_128);
        local_128._M_owns = true;
        std::
        deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
        ::emplace_back<std::function<void(unsigned_long)>>
                  ((deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
                    *)&pTVar29->tasks_,(function<void_(unsigned_long)> *)&local_118);
        std::unique_lock<std::mutex>::~unique_lock(&local_128);
        std::condition_variable::notify_one();
        if (pcStack_108 != (code *)0x0) {
          (*pcStack_108)(&local_118,&local_118,3);
        }
        uVar32 = uVar5;
      } while (uVar5 < local_188);
      pTVar29 = (local_190->executor_).thread_pool;
    }
    local_118._M_unused._M_object = &pTVar29->mutex_;
    local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_118);
    local_118._M_pod_data[8] = 1;
    while ((pTVar29->busy_count_ != 0 ||
           (((iterator *)
            ((long)&(pTVar29->tasks_).c.
                    super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
                    ._M_impl.super__Deque_impl_data + 0x30))->_M_cur !=
            ((iterator *)
            ((long)&(pTVar29->tasks_).c.
                    super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
                    ._M_impl.super__Deque_impl_data + 0x10))->_M_cur))) {
      std::condition_variable::wait((unique_lock *)&pTVar29->done_);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_118);
  }
  if (local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_180.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158.
      super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_140.
      super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.
                    super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.
                          super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.
                          super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Bvh<Node> build_top_bvh(std::vector<Bvh<Node>>& mini_trees) {
        // Build a BVH using the mini trees as leaves
        std::vector<Vec> centers(mini_trees.size());
        std::vector<BBox> bboxes(mini_trees.size());
        for (size_t i = 0; i < mini_trees.size(); ++i) {
            bboxes[i] = mini_trees[i].get_root().get_bbox();
            centers[i] = bboxes[i].get_center();
        }

        typename SweepSahBuilder<Node>::Config config = config_;
        config.max_leaf_size = config.min_leaf_size = 1; // Needs to have only one mini-tree in each leaf
        auto bvh = SweepSahBuilder<Node>::build(bboxes, centers, config);

        // Compute the offsets to apply to primitive and node indices
        std::vector<size_t> node_offsets(mini_trees.size());
        std::vector<size_t> prim_offsets(mini_trees.size());
        size_t node_count = bvh.nodes.size();
        size_t prim_count = 0;
        for (size_t i = 0; i < mini_trees.size(); ++i) {
            node_offsets[i] = node_count - 1; // Skip root node
            prim_offsets[i] = prim_count;
            node_count += mini_trees[i].nodes.size() - 1; // idem
            prim_count += mini_trees[i].prim_ids.size();
        }

        // Helper function to copy and fix the child/primitive index of a node
        auto copy_node = [&] (size_t i, Node& dst_node, const Node& src_node) {
            dst_node = src_node;
            dst_node.index.set_first_id(dst_node.index.first_id() +
                (src_node.is_leaf() ? prim_offsets[i] : node_offsets[i]));
        };

        // Make the leaves of the top BVH point to the right internal nodes
        for (auto& node : bvh.nodes) {
            if (!node.is_leaf())
                continue;
            assert(node.index.prim_count() == 1);
            size_t tree_id = bvh.prim_ids[node.index.first_id()];
            copy_node(tree_id, node, mini_trees[tree_id].get_root());
        }

        bvh.nodes.resize(node_count);
        bvh.prim_ids.resize(prim_count);
        executor_.for_each(0, mini_trees.size(),
            [&] (size_t begin, size_t end) {
                for (size_t i = begin; i < end; ++i) {
                    auto& mini_tree = mini_trees[i];

                    // Copy the nodes of the mini tree with the offsets applied, without copying
                    // the root node (since it is already copied to the top-level part of the BVH).
                    for (size_t j = 1; j < mini_tree.nodes.size(); ++j)
                        copy_node(i, bvh.nodes[node_offsets[i] + j], mini_tree.nodes[j]);

                    std::copy(
                        mini_tree.prim_ids.begin(),
                        mini_tree.prim_ids.end(),
                        bvh.prim_ids.begin() + prim_offsets[i]);
                }
            });

        return bvh;
    }